

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O3

string * __thiscall
anon_unknown.dwarf_1c7603::StringFixture::convert
          (string *__return_storage_ptr__,StringFixture *this,string *source)

{
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar1;
  string *s;
  long *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  undefined1 local_50 [16];
  undefined8 local_40;
  long local_38;
  undefined8 uStack_30;
  undefined1 local_28;
  
  local_70 = (long *)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,this,
             (long)&(source->_M_dataplus)._M_p + (long)&(this->super_Test)._vptr_Test);
  local_50._0_8_ = &PTR__string_001f2900;
  if (local_70 == (long *)&local_60) {
    uStack_30 = uStack_58;
    local_50._8_8_ = &local_38;
  }
  else {
    local_50._8_8_ = local_70;
  }
  local_38 = CONCAT71(uStack_5f,local_60);
  local_40 = local_68;
  local_68 = 0;
  local_60 = 0;
  local_28 = 0;
  local_70 = (long *)&local_60;
  (anonymous_namespace)::StringFixture::convert_abi_cxx11_(__return_storage_ptr__,local_50,s);
  if ((long *)local_50._8_8_ != &local_38) {
    operator_delete((void *)local_50._8_8_,local_38 + 1);
  }
  pstore::dump::number_base::~number_base((number_base *)local_50);
  psVar1 = extraout_RAX;
  if (local_70 != (long *)&local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    psVar1 = extraout_RAX_00;
  }
  return psVar1;
}

Assistant:

std::string StringFixture::convert (std::string const & source) const {
        return this->convert (::pstore::dump::string{source});
    }